

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolledbitpacking.h
# Opt level: O1

void FastPForLib::__unpack<5u>(uint32_t *in,uint32_t *out)

{
  uint32_t k;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  k = 0;
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar1 < 0x1c) {
      do {
        *out = *in >> (uVar2 & 0x1f) & 0x1f;
        out = out + 1;
        uVar1 = uVar2 + 5;
        bVar3 = uVar2 < 0x17;
        uVar2 = uVar1;
      } while (bVar3);
    }
    uVar2 = 0;
    if (uVar1 < 0x20) {
      *out = in[1] << ((byte)-(char)uVar1 & 0x1f) & 0x1f | *in >> (uVar1 & 0x1f);
      out = out + 1;
      uVar2 = uVar1 - 0x1b;
    }
    uVar1 = uVar2;
    k = k + 1;
    in = in + 1;
  } while (k != 5);
  return;
}

Assistant:

void __unpack(const uint32_t *__restrict__ in, uint32_t *__restrict__ out) {
  uint32_t inwordpointer = 0; // indicates where we are writing
  // k iterates over the input
  for (uint32_t k = 0; k < bit; ++k, ++in) {
    // did not unroll; compiler did not detect invariant that inwordpointer is
    // always
    // small positive number
    /* for (; inwordpointer   /\*+   bit <= 32 *\/ <= 32-bit; inwordpointer +=
     * bit) { */
    /*       *out++ = __bitmask<bit> ((*in) >> inwordpointer); */
    /*   } */
    // grungy replacement to help with unrolling
    for (uint32_t i = 0; i < 1 + 32 / bit; ++i) {
      if (inwordpointer > 32 - bit)
        break;
      *out++ = __bitmask<bit, true>((*in) >> inwordpointer);
      inwordpointer += bit;
    }
    // end ofk grunge

    if (inwordpointer < 32) {
      *out++ = (in[0] >> inwordpointer) |
               __bitmask<bit, true>(in[1] << (32 - inwordpointer));
      inwordpointer += bit - 32;
    } else
      // inwordpointer==32
      inwordpointer = 0;
  }
}